

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Versions.cpp
# Opt level: O3

bool __thiscall glslang::TParseVersions::extensionTurnedOn(TParseVersions *this,char *extension)

{
  int iVar1;
  
  iVar1 = (*this->_vptr_TParseVersions[7])();
  return iVar1 - 1U < 3;
}

Assistant:

bool TParseVersions::extensionTurnedOn(const char* const extension)
{
      switch (getExtensionBehavior(extension)) {
      case EBhEnable:
      case EBhRequire:
      case EBhWarn:
          return true;
      default:
          break;
      }
      return false;
}